

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.h
# Opt level: O2

bool __thiscall cmListFileArgument::operator==(cmListFileArgument *this,cmListFileArgument *r)

{
  __type _Var1;
  
  _Var1 = std::operator==(&this->Value,&r->Value);
  return _Var1 && this->Delim == r->Delim;
}

Assistant:

bool operator==(const cmListFileArgument& r) const
  {
    return (this->Value == r.Value) && (this->Delim == r.Delim);
  }